

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNShaperTest.cpp
# Opt level: O1

int testPermuteShape(void)

{
  RepeatedField<long> *this;
  RepeatedField<unsigned_long> *this_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  Rep *pRVar4;
  ulong uVar5;
  ConvolutionLayerParams *pCVar6;
  bool bVar7;
  FeatureType *pFVar8;
  ArrayFeatureType *pAVar9;
  long *plVar10;
  FeatureDescription *pFVar11;
  NeuralNetworkLayer *pNVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  void *pvVar14;
  PermuteLayerParams *pPVar15;
  unsigned_long *puVar16;
  ostream *poVar17;
  undefined8 *puVar18;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar19;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_01;
  uint32_t size;
  uint uVar20;
  Arena *pAVar21;
  Model m1;
  Result res;
  Model MStack_78;
  Result local_48;
  
  CoreML::Specification::Model::Model(&MStack_78,(Arena *)0x0,false);
  if (MStack_78.description_ == (ModelDescription *)0x0) {
    pAVar21 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    MStack_78.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar21);
  }
  pRVar4 = ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_00178399:
    pRVar19 = &(MStack_78.description_)->input_;
    pFVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar19->super_RepeatedPtrFieldBase).arena_);
    pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar19->super_RepeatedPtrFieldBase,pFVar11);
  }
  else {
    iVar1 = ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_00178399;
    ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar14 = pRVar4->elements[iVar1];
  }
  puVar18 = (undefined8 *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
    puVar18 = (undefined8 *)*puVar18;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar14 + 0x10),"input",puVar18);
  if (*(long *)((long)pvVar14 + 0x20) == 0) {
    pAVar21 = (Arena *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar21);
    *(FeatureType **)((long)pvVar14 + 0x20) = pFVar8;
  }
  pFVar8 = *(FeatureType **)((long)pvVar14 + 0x20);
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    uVar5 = (pFVar8->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar21);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9 = (pFVar8->Type_).multiarraytype_;
  this = &pAVar9->shape_;
  uVar2 = (pAVar9->shape_).current_size_;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar2 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(this);
  plVar10[uVar2] = 3;
  uVar20 = uVar2 + 1;
  (pAVar9->shape_).current_size_ = uVar20;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar20 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(this);
  plVar10[uVar20] = 0x40;
  uVar20 = uVar2 + 2;
  (pAVar9->shape_).current_size_ = uVar20;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar20 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(this);
  plVar10[uVar20] = 10;
  this->current_size_ = uVar2 + 3;
  if (MStack_78.description_ == (ModelDescription *)0x0) {
    pAVar21 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    MStack_78.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar21);
  }
  pRVar4 = ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_00178505:
    pRVar19 = &(MStack_78.description_)->output_;
    pFVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar19->super_RepeatedPtrFieldBase).arena_);
    pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar19->super_RepeatedPtrFieldBase,pFVar11);
  }
  else {
    iVar1 = ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_00178505;
    ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar14 = pRVar4->elements[iVar1];
  }
  puVar18 = (undefined8 *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
    puVar18 = (undefined8 *)*puVar18;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar14 + 0x10),"output",puVar18);
  if (*(long *)((long)pvVar14 + 0x20) == 0) {
    pAVar21 = (Arena *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar21);
    *(FeatureType **)((long)pvVar14 + 0x20) = pFVar8;
  }
  pFVar8 = *(FeatureType **)((long)pvVar14 + 0x20);
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    uVar5 = (pFVar8->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar21);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  if (MStack_78._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&MStack_78);
    MStack_78._oneof_case_[0] = 500;
    pAVar21 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    MStack_78.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar21);
  }
  pRVar4 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(MStack_78.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001785f5:
    this_01 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
              &(MStack_78.Type_.pipeline_)->models_;
    pNVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_01->super_RepeatedPtrFieldBase).arena_);
    pNVar12 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_01,pNVar12);
  }
  else {
    iVar1 = (MStack_78.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001785f5;
    (MStack_78.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar1 + 1;
    pNVar12 = (NeuralNetworkLayer *)pRVar4->elements[iVar1];
  }
  pRVar4 = (pNVar12->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_0017862d:
    pbVar13 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar12->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar12->input_).super_RepeatedPtrFieldBase,pbVar13);
  }
  else {
    iVar1 = (pNVar12->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_0017862d;
    (pNVar12->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar14 = pRVar4->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar14,0,*(char **)((long)pvVar14 + 8),0x3cb973);
  pRVar4 = (pNVar12->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 != (Rep *)0x0) {
    iVar1 = (pNVar12->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar4->allocated_size) {
      (pNVar12->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      pvVar14 = pRVar4->elements[iVar1];
      goto LAB_00178697;
    }
  }
  pbVar13 = google::protobuf::Arena::Create<std::__cxx11::string>
                      ((pNVar12->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar12->output_).super_RepeatedPtrFieldBase,pbVar13);
LAB_00178697:
  std::__cxx11::string::_M_replace((ulong)pvVar14,0,*(char **)((long)pvVar14 + 8),0x3dece7);
  if (pNVar12->_oneof_case_[0] != 0x136) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar12);
    pNVar12->_oneof_case_[0] = 0x136;
    uVar5 = (pNVar12->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pPVar15 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::PermuteLayerParams>
                        (pAVar21);
    (pNVar12->layer_).permute_ = pPVar15;
  }
  pCVar6 = (pNVar12->layer_).convolution_;
  this_00 = &pCVar6->kernelsize_;
  uVar2 = (pCVar6->kernelsize_).current_size_;
  uVar3 = (pCVar6->kernelsize_).total_size_;
  if (uVar2 == uVar3) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(this_00,uVar3 + 1);
  }
  puVar16 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
  puVar16[uVar2] = 0;
  uVar20 = uVar2 + 1;
  (pCVar6->kernelsize_).current_size_ = uVar20;
  uVar3 = (pCVar6->kernelsize_).total_size_;
  if (uVar20 == uVar3) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(this_00,uVar3 + 1);
  }
  puVar16 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
  puVar16[uVar20] = 3;
  uVar20 = uVar2 + 2;
  (pCVar6->kernelsize_).current_size_ = uVar20;
  uVar3 = (pCVar6->kernelsize_).total_size_;
  if (uVar20 == uVar3) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(this_00,uVar3 + 1);
  }
  puVar16 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
  puVar16[uVar20] = 2;
  uVar20 = uVar2 + 3;
  (pCVar6->kernelsize_).current_size_ = uVar20;
  uVar3 = (pCVar6->kernelsize_).total_size_;
  if (uVar20 == uVar3) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(this_00,uVar3 + 1);
  }
  puVar16 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
  puVar16[uVar20] = 1;
  this_00->current_size_ = uVar2 + 4;
  CoreML::validate<(MLModelType)500>(&local_48,&MStack_78);
  bVar7 = CoreML::Result::good(&local_48);
  if (!bVar7) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
               ,100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar17 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x107);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.m_message._M_dataplus._M_p != &local_48.m_message.field_2) {
    operator_delete(local_48.m_message._M_dataplus._M_p,
                    local_48.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&MStack_78);
  return (uint)!bVar7;
}

Assistant:

int testPermuteShape() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(3);
    shape->add_shape(64);
    shape->add_shape(10);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("output");
    out->mutable_type()->mutable_multiarraytype();

    auto *nn = m1.mutable_neuralnetwork();

    // The parameters of the layer don't match the network inputs & outputs
    Specification::NeuralNetworkLayer *permLayer = nn->add_layers();
    permLayer->add_input("input");
    permLayer->add_output("output");
    Specification::PermuteLayerParams *permParams = permLayer->mutable_permute();
    permParams->add_axis(0);
    permParams->add_axis(3);
    permParams->add_axis(2);
    permParams->add_axis(1);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    return 0;

}